

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_struct_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  _Rb_tree_header *p_Var1;
  PackedStruct *pPVar2;
  PackedStruct *pPVar3;
  pointer pcVar4;
  undefined8 this_00;
  _Alloc_hider begin;
  long *plVar5;
  size_type *psVar6;
  size_type *psVar7;
  pointer __args;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_1a0 [8];
  PortPackedVisitor visitor;
  undefined1 local_d8 [8];
  vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> structs;
  string entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type *psStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_1a0 = (undefined1  [8])&PTR_visit_root_002b9c40;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&visitor.structs_;
  visitor.structs_._M_t._M_impl._0_4_ = 0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&visitor.struct_ports_;
  visitor.struct_ports_._M_t._M_impl._0_4_ = 0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root((IRVisitor *)local_1a0,(Generator *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __str.field_2._8_8_ = __return_storage_ptr__;
  PortPackedVisitor::structs
            ((vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> *)
             local_d8,(PortPackedVisitor *)local_1a0);
  if ((undefined1  [8])
      structs.
      super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
      ._M_impl.super__Vector_impl_data._M_start != local_d8) {
    psVar7 = (size_type *)0x0;
    do {
      pPVar2 = *(pointer)((long)local_d8 + psVar7 * 8);
      structs.
      super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&entry._M_string_length;
      entry._M_dataplus._M_p = (pointer)0x0;
      entry._M_string_length._0_1_ = 0;
      std::__cxx11::string::append
                ((char *)&structs.
                          super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __args = (pPVar2->attributes).
               super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
               ._M_impl.super__Vector_impl_data._M_start;
      visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)(pPVar2->attributes).
                   super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (__args != (pointer)visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header._M_node_count)
      {
        do {
          this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    (entry.field_2._M_local_buf + 8);
          pPVar3 = __args->struct_;
          if (pPVar3 == (PackedStruct *)0x0) {
            local_50 = (undefined1  [8])&name._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"    logic","");
            __l._M_len = 1;
            __l._M_array = (string *)local_50;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_01,__l,(allocator_type *)&psStack_78);
            if (local_50 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)local_50,name._M_string_length + 1);
            }
            if (1 < __args->width) {
              psStack_78 = (size_type *)(ulong)(__args->width - 1);
              format_str.size_ = 2;
              format_str.data_ = (char *)0x7;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&psStack_78;
              in_R8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&psStack_78;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)local_50,(detail *)"[{0}:0]",format_str,args);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(this_01,(string *)local_50);
              if (local_50 != (undefined1  [8])&name._M_string_length) {
                operator_delete((void *)local_50,name._M_string_length + 1);
              }
            }
            if (__args->signed_ == true) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[7]>(this_01,(char (*) [7])0x245c87);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>(this_01,&__args->name);
            begin = __str._M_dataplus;
            this_00 = entry.field_2._8_8_;
            psStack_78 = &__str_1._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>((string *)&psStack_78," ","");
            string::
            join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((string *)local_50,(string *)this_00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )begin._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &psStack_78,in_R8._M_current);
            if (psStack_78 != &__str_1._M_string_length) {
              operator_delete(psStack_78,__str_1._M_string_length + 1);
            }
            psStack_78 = &__str_1._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&psStack_78,local_50,name._M_dataplus._M_p + (long)local_50);
            std::__cxx11::string::append((char *)&psStack_78);
            std::__cxx11::string::_M_append
                      ((char *)&structs.
                                super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)psStack_78
                      );
            if (psStack_78 != &__str_1._M_string_length) {
              operator_delete(psStack_78,__str_1._M_string_length + 1);
            }
            if (local_50 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)local_50,name._M_string_length + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&entry.field_2 + 8));
          }
          else {
            entry.field_2._8_8_ = &__str._M_string_length;
            pcVar4 = (pPVar3->struct_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)this_01,pcVar4,pcVar4 + (pPVar3->struct_name)._M_string_length);
            std::__cxx11::string::append((char *)this_01);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)this_01,(ulong)(__args->name)._M_dataplus._M_p);
            psStack_78 = &__str_1._M_string_length;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar6) {
              __str_1._M_string_length = *psVar6;
              __str_1.field_2._M_allocated_capacity = plVar5[3];
            }
            else {
              __str_1._M_string_length = *psVar6;
              psStack_78 = (size_type *)*plVar5;
            }
            __str_1._M_dataplus._M_p = (pointer)plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&psStack_78);
            local_50 = (undefined1  [8])&name._M_string_length;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar6) {
              name._M_string_length = *psVar6;
              name.field_2._M_allocated_capacity = plVar5[3];
            }
            else {
              name._M_string_length = *psVar6;
              local_50 = (undefined1  [8])*plVar5;
            }
            name._M_dataplus._M_p = (pointer)plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&structs.
                                super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_50);
            if (local_50 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)local_50,name._M_string_length + 1);
            }
            if (psStack_78 != &__str_1._M_string_length) {
              operator_delete(psStack_78,__str_1._M_string_length + 1);
            }
            if ((size_type *)entry.field_2._8_8_ != &__str._M_string_length) {
              operator_delete((void *)entry.field_2._8_8_,__str._M_string_length + 1);
            }
          }
          __args = __args + 1;
        } while (__args != (pointer)visitor.struct_ports_._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
      }
      psStack_78 = (size_type *)(pPVar2->struct_name)._M_dataplus._M_p;
      __str_1._M_dataplus._M_p = (pointer)(pPVar2->struct_name)._M_string_length;
      format_str_00.size_ = 0xd;
      format_str_00.data_ = (char *)0x8;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&psStack_78;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_50,(detail *)"}} {0};\n",format_str_00,args_00);
      std::__cxx11::string::_M_append
                ((char *)&structs.
                          super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_50);
      if (local_50 != (undefined1  [8])&name._M_string_length) {
        operator_delete((void *)local_50,name._M_string_length + 1);
      }
      format_str_01.size_ = 2;
      format_str_01.data_ = (char *)0x8;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&psStack_78;
      in_R8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&psStack_78;
      psStack_78 = psVar7;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_50,(detail *)"{0:032d}",format_str_01,args_01);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)__str.field_2._8_8_,(string *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &structs.
                  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_50 != (undefined1  [8])&name._M_string_length) {
        operator_delete((void *)local_50,name._M_string_length + 1);
      }
      if (structs.
          super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&entry._M_string_length) {
        operator_delete(structs.
                        super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(entry._M_string_length._1_7_,(undefined1)entry._M_string_length) +
                        1);
      }
      psVar7 = (size_type *)(ulong)((int)psVar7 + 1);
    } while (psVar7 < (undefined1 *)
                      ((long)structs.
                             super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_d8 >> 3));
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,
                    (long)structs.
                          super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_d8);
  }
  local_1a0 = (undefined1  [8])&PTR_visit_root_002b9c40;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
               *)&visitor.structs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
               *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_1a0 = (undefined1  [8])&PTR_visit_root_002b4ad8;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)__str.field_2._8_8_;
}

Assistant:

std::map<std::string, std::string> extract_struct_info(Generator* top) {
    PortPackedVisitor visitor;
    visitor.visit_generator_root(top);

    // convert the definition into
    std::map<std::string, std::string> result;
    auto const structs = visitor.structs();
    for (uint32_t i = 0; i < structs.size(); i++) {
        auto const* struct_ = structs[i];
        // TODO:
        //  Use Stream class in the codegen instead to track the debugging info
        //  Share the same code gen logic with Stream
        std::string entry;
        entry.append("typedef struct packed {\n");

        for (auto const& def : struct_->attributes) {
            if (!def.struct_) {
                std::vector<std::string> str = {"    logic"};
                if (def.width > 1) str.emplace_back(::format("[{0}:0]", def.width - 1));
                if (def.signed_) str.emplace_back("signed");
                str.emplace_back(def.name);
                auto entry_str = string::join(str.begin(), str.end(), " ");
                entry.append(entry_str + ";\n");
            } else {
                entry.append(def.struct_->struct_name + " " + def.name + ";\n");
            }
        }
        entry.append(::format("}} {0};\n", struct_->struct_name));
        // this is a hack to ensure ordering. refactoring this requires refactoring
        // code from the caller site
        auto name = fmt::format("{0:032d}", i);
        result.emplace(name, entry);
    }
    return result;
}